

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_SetWindowSize(ImGuiViewport *viewport,ImVec2 size)

{
  int iVar1;
  GLFWwindow *in_RDI;
  ImGuiViewportDataGlfw *data;
  long lVar2;
  
  lVar2 = *(long *)(in_RDI + 0x38);
  iVar1 = ImGui::GetFrameCount();
  *(int *)(lVar2 + 0xc) = iVar1;
  glfwSetWindowSize(in_RDI,(int)((ulong)lVar2 >> 0x20),(int)lVar2);
  return;
}

Assistant:

static void ImGui_ImplGlfw_SetWindowSize(ImGuiViewport* viewport, ImVec2 size)
{
    ImGuiViewportDataGlfw* data = (ImGuiViewportDataGlfw*)viewport->PlatformUserData;
#if __APPLE__
    // Native OS windows are positioned from the bottom-left corner on macOS, whereas on other platforms they are
    // positioned from the upper-left corner. GLFW makes an effort to convert macOS style coordinates, however it
    // doesn't handle it when changing size. We are manually moving the window in order for changes of size to be based
    // on the upper-left corner.
    int x, y, width, height;
    glfwGetWindowPos(data->Window, &x, &y);
    glfwGetWindowSize(data->Window, &width, &height);
    glfwSetWindowPos(data->Window, x, y - height + size.y);
#endif
    data->IgnoreWindowSizeEventFrame = ImGui::GetFrameCount();
    glfwSetWindowSize(data->Window, (int)size.x, (int)size.y);
}